

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qendian.cpp
# Opt level: O2

void * qbswap<2>(void *source,qsizetype n,void *dest)

{
  ushort uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  uVar2 = n * 2;
  uVar3 = 0;
  while (uVar3 + 0x20 <= uVar2) {
    auVar5 = *(undefined1 (*) [16])((long)source + uVar3);
    auVar6 = *(undefined1 (*) [16])((long)source + uVar3 + 0x10);
    auVar7._0_2_ = auVar5._0_2_ >> 8;
    auVar7._2_2_ = auVar5._2_2_ >> 8;
    auVar7._4_2_ = auVar5._4_2_ >> 8;
    auVar7._6_2_ = auVar5._6_2_ >> 8;
    auVar7._8_2_ = auVar5._8_2_ >> 8;
    auVar7._10_2_ = auVar5._10_2_ >> 8;
    auVar7._12_2_ = auVar5._12_2_ >> 8;
    auVar7._14_2_ = auVar5._14_2_ >> 8;
    auVar5 = psllw(auVar5,8);
    auVar8._0_2_ = auVar6._0_2_ >> 8;
    auVar8._2_2_ = auVar6._2_2_ >> 8;
    auVar8._4_2_ = auVar6._4_2_ >> 8;
    auVar8._6_2_ = auVar6._6_2_ >> 8;
    auVar8._8_2_ = auVar6._8_2_ >> 8;
    auVar8._10_2_ = auVar6._10_2_ >> 8;
    auVar8._12_2_ = auVar6._12_2_ >> 8;
    auVar8._14_2_ = auVar6._14_2_ >> 8;
    auVar6 = psllw(auVar6,8);
    *(undefined1 (*) [16])((long)dest + uVar3) = auVar5 | auVar7;
    *(undefined1 (*) [16])((long)dest + uVar3 + 0x10) = auVar6 | auVar8;
    uVar3 = uVar3 + 0x20;
  }
  if (uVar3 + 0x10 <= uVar2) {
    auVar5 = *(undefined1 (*) [16])((long)source + uVar3);
    auVar6._0_2_ = auVar5._0_2_ >> 8;
    auVar6._2_2_ = auVar5._2_2_ >> 8;
    auVar6._4_2_ = auVar5._4_2_ >> 8;
    auVar6._6_2_ = auVar5._6_2_ >> 8;
    auVar6._8_2_ = auVar5._8_2_ >> 8;
    auVar6._10_2_ = auVar5._10_2_ >> 8;
    auVar6._12_2_ = auVar5._12_2_ >> 8;
    auVar6._14_2_ = auVar5._14_2_ >> 8;
    auVar5 = psllw(auVar5,8);
    *(undefined1 (*) [16])((long)dest + uVar3) = auVar5 | auVar6;
    uVar3 = uVar3 + 0x10;
  }
  for (uVar4 = 0; (uVar3 + uVar4 < uVar2 && (uVar4 < 0x10)); uVar4 = uVar4 + 2) {
    uVar1 = *(ushort *)((long)source + uVar4 + uVar3);
    *(ushort *)((long)dest + uVar4 + uVar3) = uVar1 << 8 | uVar1 >> 8;
  }
  return (void *)((long)dest + uVar2);
}

Assistant:

void *qbswap<2>(const void *source, qsizetype n, void *dest) noexcept
{
    const uchar *src = reinterpret_cast<const uchar *>(source);
    uchar *dst = reinterpret_cast<uchar *>(dest);

    return bswapLoop<quint16>(src, n << 1, dst);
}